

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_0::AsyncifyAssertInNonInstrumented::runOnFunction
          (AsyncifyAssertInNonInstrumented *this,Module *module_,Function *func)

{
  bool bVar1;
  Function *local_20;
  Function *func_local;
  Module *module__local;
  AsyncifyAssertInNonInstrumented *this_local;
  
  local_20 = func;
  func_local = (Function *)module_;
  module__local = (Module *)this;
  bVar1 = anon_unknown_0::ModuleAnalyzer::needsInstrumentation(this->analyzer,func);
  if (!bVar1) {
    this->module = (Module *)func_local;
    std::
    make_unique<wasm::(anonymous_namespace)::AsyncifyBuilder,wasm::Module&,wasm::Type&,wasm::Name&>
              ((Module *)&stack0xffffffffffffffd8,(Type *)this->module,(Name *)&this->pointerType);
    std::
    unique_ptr<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
    ::operator=(&this->builder,
                (unique_ptr<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                 *)&stack0xffffffffffffffd8);
    std::
    unique_ptr<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
    ::~unique_ptr((unique_ptr<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                   *)&stack0xffffffffffffffd8);
    addAssertsInNonInstrumented(this,local_20);
  }
  return;
}

Assistant:

void runOnFunction(Module* module_, Function* func) override {
    // FIXME: This looks like it was never right, as it should ignore the top-
    //        most runtime, but it will actually instrument it (as it needs no
    //        instrumentation, like random code - but the top-most runtime is
    //        actually a place that needs neither instrumentation *nor*
    //        assertions, as the assertions will error when it changes the
    //        state).
    if (!analyzer->needsInstrumentation(func)) {
      module = module_;
      builder =
        std::make_unique<AsyncifyBuilder>(*module, pointerType, asyncifyMemory);
      addAssertsInNonInstrumented(func);
    }
  }